

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O1

void __thiscall FVoxelTexture::FVoxelTexture(FVoxelTexture *this,FVoxel *vox)

{
  undefined1 *puVar1;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FVoxelTexture_00844898;
  this->SourceVox = vox;
  (this->super_FTexture).Width = 0x10;
  (this->super_FTexture).Height = 0x10;
  (this->super_FTexture).WidthBits = '\x04';
  (this->super_FTexture).HeightBits = '\x04';
  (this->super_FTexture).WidthMask = 0xf;
  this->Pixels = (BYTE *)0x0;
  puVar1 = &(this->super_FTexture).gl_info.field_0x4d;
  *puVar1 = *puVar1 | 3;
  return;
}

Assistant:

FVoxelTexture::FVoxelTexture(FVoxel *vox)
{
	SourceVox = vox;
	Width = 16;
	Height = 16;
	WidthBits = 4;
	HeightBits = 4;
	WidthMask = 15;
	Pixels = NULL;
	gl_info.bNoFilter = true;
	gl_info.bNoCompress = true;
}